

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFileWriter.cpp
# Opt level: O2

void __thiscall AudioFileRenderer::~AudioFileRenderer(AudioFileRenderer *this)

{
  MidiParser *pMVar1;
  long lVar2;
  int in_ESI;
  long lVar3;
  
  *(undefined ***)this = &PTR_metaObject_001a61f8;
  stop(this);
  if ((this->realtimeMode == false) && ((this->audioRenderer).synth != (QSynth *)0x0)) {
    QSynth::close((this->audioRenderer).synth,in_ESI);
    if ((this->audioRenderer).audioStream != (AudioFileWriterStream *)0x0) {
      (*(((this->audioRenderer).audioStream)->super_AudioStream)._vptr_AudioStream[4])();
    }
  }
  pMVar1 = this->parsers;
  if (pMVar1 != (MidiParser *)0x0) {
    lVar2 = *(long *)&pMVar1[-1].division;
    if (lVar2 != 0) {
      lVar3 = lVar2 << 6;
      do {
        MidiParser::~MidiParser
                  ((MidiParser *)
                   ((long)&pMVar1[-1].super_MidiStreamSource._vptr_MidiStreamSource + lVar3));
        lVar3 = lVar3 + -0x40;
      } while (lVar3 != 0);
    }
    operator_delete__(&pMVar1[-1].division,lVar2 << 6 | 8);
  }
  if (this->buffer != (qint16 *)0x0) {
    operator_delete__(this->buffer);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->outFileName).d);
  QThread::~QThread(&this->super_QThread);
  return;
}

Assistant:

AudioFileRenderer::~AudioFileRenderer() {
	stop();
	if (!realtimeMode && audioRenderer.synth != NULL) {
		audioRenderer.synth->close();
		delete audioRenderer.synth;
	}
	delete[] parsers;
	delete[] buffer;
}